

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

Matcher<const_std::vector<char,_std::allocator<char>_>_&> * __thiscall
testing::internal::ElementsAreMatcher::operator_cast_to_Matcher
          (Matcher<const_std::vector<char,_std::allocator<char>_>_&> *__return_storage_ptr__,
          ElementsAreMatcher *this)

{
  ElementsAreMatcherImpl<std::vector<char,std::allocator<char>>const&> *this_00;
  MatcherVec matchers;
  
  matchers.
  super__Vector_base<testing::Matcher<const_char_&>,_std::allocator<testing::Matcher<const_char_&>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  matchers.
  super__Vector_base<testing::Matcher<const_char_&>,_std::allocator<testing::Matcher<const_char_&>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  matchers.
  super__Vector_base<testing::Matcher<const_char_&>,_std::allocator<testing::Matcher<const_char_&>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<testing::Matcher<const_char_&>,_std::allocator<testing::Matcher<const_char_&>_>_>::
  reserve(&matchers,2);
  TransformTupleValuesHelper<std::tuple<char,_char>,_testing::internal::CastAndAppendTransform<const_char_&>,_std::back_insert_iterator<std::vector<testing::Matcher<const_char_&>,_std::allocator<testing::Matcher<const_char_&>_>_>_>_>
  ::Run(this,&matchers);
  this_00 = (ElementsAreMatcherImpl<std::vector<char,std::allocator<char>>const&> *)
            operator_new(0x20);
  ElementsAreMatcherImpl<std::vector<char,std::allocator<char>>const&>::
  ElementsAreMatcherImpl<__gnu_cxx::__normal_iterator<testing::Matcher<char_const&>*,std::vector<testing::Matcher<char_const&>,std::allocator<testing::Matcher<char_const&>>>>>
            (this_00,(__normal_iterator<testing::Matcher<const_char_&>_*,_std::vector<testing::Matcher<const_char_&>,_std::allocator<testing::Matcher<const_char_&>_>_>_>
                      )matchers.
                       super__Vector_base<testing::Matcher<const_char_&>,_std::allocator<testing::Matcher<const_char_&>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<testing::Matcher<const_char_&>_*,_std::vector<testing::Matcher<const_char_&>,_std::allocator<testing::Matcher<const_char_&>_>_>_>
              )matchers.
               super__Vector_base<testing::Matcher<const_char_&>,_std::allocator<testing::Matcher<const_char_&>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  Matcher<const_std::vector<char,_std::allocator<char>_>_&>::Matcher
            (__return_storage_ptr__,
             (MatcherInterface<const_std::vector<char,_std::allocator<char>_>_&> *)this_00);
  std::vector<testing::Matcher<const_char_&>,_std::allocator<testing::Matcher<const_char_&>_>_>::
  ~vector(&matchers);
  return __return_storage_ptr__;
}

Assistant:

operator Matcher<Container>() const {
    GTEST_COMPILE_ASSERT_(
        !IsHashTable<GTEST_REMOVE_REFERENCE_AND_CONST_(Container)>::value ||
            ::std::tuple_size<MatcherTuple>::value < 2,
        use_UnorderedElementsAre_with_hash_tables);

    typedef GTEST_REMOVE_REFERENCE_AND_CONST_(Container) RawContainer;
    typedef typename internal::StlContainerView<RawContainer>::type View;
    typedef typename View::value_type Element;
    typedef ::std::vector<Matcher<const Element&> > MatcherVec;
    MatcherVec matchers;
    matchers.reserve(::std::tuple_size<MatcherTuple>::value);
    TransformTupleValues(CastAndAppendTransform<const Element&>(), matchers_,
                         ::std::back_inserter(matchers));
    return Matcher<Container>(new ElementsAreMatcherImpl<const Container&>(
        matchers.begin(), matchers.end()));
  }